

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O1

void __thiscall SMBusAnalyzerSettings::SMBusAnalyzerSettings(SMBusAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *this_02;
  AnalyzerSettingInterfaceBool *this_03;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SMBusAnalyzerSettings_0011c558;
  Channel::Channel(&this->mSMBDAT,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mSMBCLK,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mDecodeLevel = DL_Signals;
  this_00 = &this->mSMBDATInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  this_01 = &this->mSMBCLKInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  this_02 = &this->mDecodeLevelInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  this_03 = &this->mCalculatePECInterface;
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(this_03);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"SMBDAT");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"SMBCLK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02,"SMBus decode level");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_02,"Signals");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_02,"Bytes");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_02,"SMBus");
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)this_02,"PMBus");
  AnalyzerSettingInterfaceNumberList::AddNumber(4.0,(char *)this_02,"Smart Battery");
  AnalyzerSettingInterfaceNumberList::SetNumber(0.0);
  AnalyzerSettingInterfaceBool::SetValue(SUB81(this_03,0));
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03,"Calculate PEC on packets");
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBDAT,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBCLK,true);
  return;
}

Assistant:

SMBusAnalyzerSettings::SMBusAnalyzerSettings() : mSMBDAT( UNDEFINED_CHANNEL ), mSMBCLK( UNDEFINED_CHANNEL ), mDecodeLevel( DL_Signals )
{
    // init the interface
    mSMBDATInterface.SetTitleAndTooltip( "SMBDAT", "SMBus data line" );
    mSMBDATInterface.SetChannel( mSMBDAT );

    mSMBCLKInterface.SetTitleAndTooltip( "SMBCLK", "SMBus clock line" );
    mSMBCLKInterface.SetChannel( mSMBCLK );

    mDecodeLevelInterface.SetTitleAndTooltip( "SMBus decode level", "Type of decoded SMBus data" );
    mDecodeLevelInterface.AddNumber( DL_Signals, "Signals", "Decode the signal states" );
    mDecodeLevelInterface.AddNumber( DL_Bytes, "Bytes", "Decode the data as raw bytes" );
    mDecodeLevelInterface.AddNumber( DL_SMBus, "SMBus", "Decode SMBus basic protocol" );
    mDecodeLevelInterface.AddNumber( DL_PMBus, "PMBus", "Decode PMBus commands" );
    mDecodeLevelInterface.AddNumber( DL_SmartBattery, "Smart Battery", "Decode Smart Battery commands" );

    mDecodeLevelInterface.SetNumber( DL_Signals );

    mCalculatePECInterface.SetValue( true );
    mCalculatePECInterface.SetTitleAndTooltip( "Calculate PEC on packets", "true - calculate PEC, false - no PEC on packets" );

    // add the interfaces
    AddInterface( &mSMBDATInterface );
    AddInterface( &mSMBCLKInterface );
    AddInterface( &mDecodeLevelInterface );
    AddInterface( &mCalculatePECInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mSMBDAT, "SMBDAT", false );
    AddChannel( mSMBCLK, "SMBCLK", false );
}